

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

PLYElement * gvr::PLYElement::fromString(string *s)

{
  int iVar1;
  PLYElement *this;
  IOException *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  long n;
  istringstream in;
  
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gutil::split(&list,s,' ',true);
  iVar1 = std::__cxx11::string::compare
                    ((char *)list.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar1 == 0) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)&in,
               (string *)
               (list.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + 2),_S_in);
    std::istream::_M_extract<long>((long *)&in);
    this = (PLYElement *)operator_new(0x40);
    PLYElement(this,list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1,n);
    std::__cxx11::istringstream::~istringstream((istringstream *)&in);
  }
  else {
    iVar1 = std::__cxx11::string::compare
                      ((char *)list.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
    if (iVar1 != 0) {
      this_00 = (IOException *)__cxa_allocate_exception(0x28);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                     "Invalid PLY element definition: ",s);
      gutil::IOException::IOException(this_00,(string *)&in);
      __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    this = (PLYElement *)operator_new(0x40);
    std::__cxx11::string::substr((ulong)&in,(ulong)s);
    PLYElement(this,(string *)&in,-1);
    std::__cxx11::string::~string((string *)&in);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&list);
  return this;
}

Assistant:

PLYElement *PLYElement::fromString(const std::string &s)
{
  std::vector<std::string> list;

  gutil::split(list, s);

  if (list[0].compare("element") == 0)
  {
    long n;
    std::istringstream in(list[2]);
    in >> n;

    return new PLYElement(list[1], n);
  }
  else if (list[0].compare("comment") == 0)
  {
    return new PLYElement(s.substr(8), -1);
  }
  else
  {
    throw gutil::IOException("Invalid PLY element definition: "+s);
  }
}